

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O2

int write_dns_response_by_query(char *buffer,answer *answer,uint16_t answer_num)

{
  int iVar1;
  ulong uVar2;
  char *pcVar3;
  bool bVar4;
  
  buffer[2] = -0x80;
  buffer[3] = '\0';
  *(uint16_t *)(buffer + 6) = answer_num << 8 | answer_num >> 8;
  for (pcVar3 = buffer + 0xc; (long)*pcVar3 != 0; pcVar3 = pcVar3 + (long)*pcVar3 + 1) {
  }
  pcVar3 = pcVar3 + 5;
  uVar2 = (ulong)answer_num;
  while (bVar4 = uVar2 != 0, uVar2 = uVar2 - 1, bVar4) {
    iVar1 = write_dns_answer(pcVar3,answer->name,(uint)answer->type,(uint)answer->class_,answer->ttl
                             ,&answer->address);
    pcVar3 = pcVar3 + iVar1;
    answer = answer + 1;
  }
  return (int)pcVar3 - (int)buffer;
}

Assistant:

int write_dns_response_by_query(char *buffer, struct answer answer[],
                                uint16_t answer_num) {
  struct dns_header *header;
  header = (struct dns_header *)buffer;
  header->flags = htons(FLAG_RESPONSE_NORMAL);
  header->ancount = htons(answer_num);
  char *data = skip_to_answer(buffer);
  for (int i = 0; i < answer_num; i++) {
    data +=
        write_dns_answer(data, answer[i].name, answer[i].type, answer[i].class_,
                         answer[i].ttl, &answer[i].address);
    //                                                                                    ^^^^^^^^^^^^^^^^^^
    //                                                                                  无论是cname还是address，开始地址都是相同的。
    //                                                                                  在write_dns_answer中，rdata会被确定为具体的类型
  }
  return data - buffer;
}